

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void Diffusion::computeExtensiveFluxes
               (MLMG *a_mg,MultiFab *Soln,MultiFab **flux,int fluxComp,int ncomp,MultiFab *area,
               Real fac)

{
  initializer_list<std::array<amrex::MultiFab_*,_3UL>_> iVar1;
  initializer_list<amrex::MultiFab_*> iVar2;
  uint uVar3;
  bool bVar4;
  FabType FVar5;
  FabFactory<amrex::FArrayBox> *pFVar6;
  MFItInfo *this;
  long lVar7;
  undefined8 in_RSI;
  int in_R8D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int i_8;
  int j_8;
  int k_8;
  int n_8;
  Dim3 amrex_i_hi_8;
  Dim3 amrex_i_lo_8;
  int i_7;
  int j_7;
  int k_7;
  int n_7;
  Dim3 amrex_i_hi_7;
  Dim3 amrex_i_lo_7;
  int i_6;
  int j_6;
  int k_6;
  int n_6;
  Dim3 amrex_i_hi_6;
  Dim3 amrex_i_lo_6;
  int i_5;
  int j_5;
  int k_5;
  int n_5;
  Dim3 amrex_i_hi_5;
  Dim3 amrex_i_lo_5;
  int i_4;
  int j_4;
  int k_4;
  int n_4;
  Dim3 amrex_i_hi_4;
  Dim3 amrex_i_lo_4;
  int i_3;
  int j_3;
  int k_3;
  int n_3;
  Dim3 amrex_i_hi_3;
  Dim3 amrex_i_lo_3;
  Array4<const_double> *afrac_z;
  Array4<const_double> *afrac_y;
  Array4<const_double> *afrac_x;
  Box result_1;
  int i_2;
  int j_2;
  int k_2;
  int n_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box result;
  EBCellFlagFab *flags;
  EBFArrayBox *cc_fab;
  Box bx;
  Array4<double> *areaz;
  Array4<double> *areay;
  Array4<double> *areax;
  Box wbx;
  Box vbx;
  Box ubx;
  Array4<double> *fz;
  Array4<double> *fy;
  Array4<double> *fx;
  MFIter mfi;
  MFItInfo mfi_info;
  Array<const_MultiCutFab_*,_3> areafrac;
  EBFArrayBoxFactory *ebfactory;
  array<amrex::MultiFab_*,_3UL> fp;
  MultiFab flxz;
  MultiFab flxy;
  MultiFab flxx;
  MFIter *in_stack_ffffffffffffebc8;
  MultiCutFab *in_stack_ffffffffffffebd0;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffebd8;
  MFItInfo *in_stack_ffffffffffffebe0;
  MLMG *in_stack_ffffffffffffebe8;
  long *plVar8;
  MFItInfo *in_stack_ffffffffffffebf0;
  FabArrayBase *in_stack_ffffffffffffebf8;
  MFIter *in_stack_ffffffffffffec00;
  MFIter *this_00;
  EBCellFlagFab *in_stack_ffffffffffffec38;
  int iVar9;
  MFIter *this_01;
  uint local_1390;
  int local_138c;
  int local_1388;
  int local_1384;
  int local_1340;
  int local_133c;
  int local_1338;
  int local_1334;
  Box *in_stack_ffffffffffffecf0;
  int in_stack_ffffffffffffecf8;
  undefined4 in_stack_ffffffffffffecfc;
  int local_12f0;
  int local_12ec;
  int local_12e8;
  int local_12e4;
  uint local_12a0;
  int local_129c;
  int local_1298;
  int local_1294;
  int local_1250;
  int local_124c;
  int local_1248;
  int local_1244;
  int local_1200;
  int local_11fc;
  int local_11f8;
  int local_11f4;
  long local_11b0 [8];
  long *local_1170;
  undefined1 local_1168 [136];
  MFIter *local_10e0;
  Box local_10d4;
  uint local_10b8;
  int local_10b4;
  int local_10b0;
  int local_10ac;
  int local_1068;
  int local_1064;
  int local_1060;
  int local_105c;
  int local_1018;
  int local_1014;
  int local_1010;
  int local_100c;
  Box local_fcc;
  EBCellFlagFab *local_fb0;
  EBFArrayBox *local_fa8;
  undefined1 local_f9c [28];
  long local_f80 [8];
  long *local_f40;
  long local_f38 [8];
  long *local_ef8;
  long local_ef0 [8];
  long *local_eb0;
  uint local_ea4;
  int local_ea0;
  int iStack_e9c;
  int iStack_e98;
  int local_e94;
  int iStack_e90;
  int local_e88;
  int local_e84;
  int iStack_e80;
  int iStack_e7c;
  int local_e78;
  int iStack_e74;
  int local_e6c;
  int local_e68;
  int iStack_e64;
  int iStack_e60;
  int local_e5c;
  int iStack_e58;
  long local_e50 [8];
  long *local_e10;
  long local_e08 [8];
  long *local_dc8;
  long local_dc0 [8];
  long *local_d80;
  MFIter local_d78;
  undefined1 local_d14 [28];
  undefined1 auStack_cf8 [16];
  undefined1 local_ce8 [168];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c40;
  element_type *local_c38;
  element_type local_c30 [4];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_aa0 [24];
  element_type local_920 [12];
  double local_7a0;
  int local_790;
  undefined8 local_780;
  undefined4 local_76c;
  undefined1 *local_768;
  undefined4 local_75c;
  undefined1 *local_758;
  uint *local_740;
  undefined4 local_72c;
  uint *local_728;
  undefined4 local_71c;
  uint *local_718;
  undefined4 local_70c;
  uint *local_708;
  int *local_6f0;
  undefined4 local_6dc;
  int *local_6d8;
  undefined4 local_6cc;
  int *local_6c8;
  undefined4 local_6bc;
  int *local_6b8;
  int *local_6a0;
  undefined4 local_68c;
  int *local_688;
  undefined4 local_67c;
  int *local_678;
  undefined4 local_66c;
  int *local_668;
  uint *local_650;
  undefined4 local_63c;
  uint *local_638;
  undefined4 local_62c;
  uint *local_628;
  undefined4 local_61c;
  uint *local_618;
  int *local_600;
  undefined4 local_5ec;
  int *local_5e8;
  undefined4 local_5dc;
  int *local_5d8;
  undefined4 local_5cc;
  int *local_5c8;
  int *local_5b0;
  undefined4 local_59c;
  int *local_598;
  undefined4 local_58c;
  int *local_588;
  undefined4 local_57c;
  int *local_578;
  uint *local_560;
  undefined4 local_54c;
  uint *local_548;
  undefined4 local_53c;
  uint *local_538;
  undefined4 local_52c;
  uint *local_528;
  int *local_510;
  undefined4 local_4fc;
  int *local_4f8;
  undefined4 local_4ec;
  int *local_4e8;
  undefined4 local_4dc;
  int *local_4d8;
  int *local_4c0;
  undefined4 local_4ac;
  int *local_4a8;
  undefined4 local_49c;
  int *local_498;
  undefined4 local_48c;
  int *local_488;
  uint *local_470;
  undefined4 local_45c;
  int *local_458;
  undefined4 local_44c;
  int *local_448;
  undefined4 local_43c;
  int *local_438;
  int *local_420;
  undefined4 local_40c;
  int *local_408;
  undefined4 local_3fc;
  int *local_3f8;
  undefined4 local_3ec;
  int *local_3e8;
  int *local_3d0;
  undefined4 local_3bc;
  int *local_3b8;
  undefined4 local_3ac;
  int *local_3a8;
  undefined4 local_39c;
  int *local_398;
  uint *local_380;
  undefined4 local_36c;
  int *local_368;
  undefined4 local_35c;
  int *local_358;
  undefined4 local_34c;
  int *local_348;
  int *local_330;
  undefined4 local_31c;
  int *local_318;
  undefined4 local_30c;
  int *local_308;
  undefined4 local_2fc;
  int *local_2f8;
  int *local_2e0;
  undefined4 local_2cc;
  int *local_2c8;
  undefined4 local_2bc;
  int *local_2b8;
  undefined4 local_2ac;
  int *local_2a8;
  uint *local_290;
  undefined4 local_27c;
  int *local_278;
  undefined4 local_26c;
  int *local_268;
  undefined4 local_25c;
  int *local_258;
  int *local_240;
  undefined4 local_22c;
  int *local_228;
  undefined4 local_21c;
  int *local_218;
  undefined4 local_20c;
  int *local_208;
  int *local_1f0;
  undefined4 local_1dc;
  int *local_1d8;
  undefined4 local_1cc;
  int *local_1c8;
  undefined4 local_1bc;
  int *local_1b8;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  uint local_1a4;
  long *local_1a0;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  long *local_188;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  long *local_170;
  int local_168;
  int local_164;
  int local_160;
  uint local_15c;
  long *local_158;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  long *local_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  long *local_128;
  int local_120;
  int local_11c;
  int local_118;
  uint local_114;
  long *local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  long *local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  long *local_e0;
  int local_d4;
  int local_d0;
  uint local_cc;
  long *local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  long *local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  int local_8c;
  int local_88;
  uint local_84;
  long *local_80;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  int local_5c;
  int local_58;
  int local_54;
  long *local_50;
  int local_44;
  int local_40;
  uint local_3c;
  long *local_38;
  int local_2c;
  int local_28;
  int local_24;
  MultiCutFab *local_20;
  int local_14;
  int local_10;
  int local_c;
  MFIter *local_8;
  
  local_7a0 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_790 = in_R8D;
  local_780 = in_RSI;
  amrex::MultiFab::MultiFab
            ((MultiFab *)in_stack_ffffffffffffebe0,(MultiFab *)in_stack_ffffffffffffebd8,
             (MakeType)((ulong)in_stack_ffffffffffffebd0 >> 0x20),(int)in_stack_ffffffffffffebd0,
             (int)((ulong)in_stack_ffffffffffffebc8 >> 0x20));
  amrex::MultiFab::MultiFab
            ((MultiFab *)in_stack_ffffffffffffebe0,(MultiFab *)in_stack_ffffffffffffebd8,
             (MakeType)((ulong)in_stack_ffffffffffffebd0 >> 0x20),(int)in_stack_ffffffffffffebd0,
             (int)((ulong)in_stack_ffffffffffffebc8 >> 0x20));
  amrex::MultiFab::MultiFab
            ((MultiFab *)in_stack_ffffffffffffebe0,(MultiFab *)in_stack_ffffffffffffebd8,
             (MakeType)((ulong)in_stack_ffffffffffffebd0 >> 0x20),(int)in_stack_ffffffffffffebd0,
             (int)((ulong)in_stack_ffffffffffffebc8 >> 0x20));
  local_ce8._96_8_ = local_920;
  local_ce8._104_8_ = local_aa0;
  local_ce8._112_8_ = local_c30;
  local_ce8._120_8_ = local_ce8 + 0x60;
  local_ce8._128_8_ = (pointer)0x1;
  local_ce8._160_8_ = local_ce8._96_8_;
  p_Stack_c40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ce8._104_8_;
  local_c38 = (element_type *)local_ce8._112_8_;
  std::allocator<std::array<amrex::MultiFab_*,_3UL>_>::allocator
            ((allocator<std::array<amrex::MultiFab_*,_3UL>_> *)0x85f6ad);
  iVar1._M_len = (size_type)in_stack_ffffffffffffebe0;
  iVar1._M_array = (iterator)in_stack_ffffffffffffebd8;
  amrex::
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>::
  vector((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *)in_stack_ffffffffffffebd0,iVar1,(allocator_type *)in_stack_ffffffffffffebc8);
  local_ce8._40_8_ = local_780;
  local_ce8._48_8_ = local_ce8 + 0x28;
  local_ce8._56_8_ = 1;
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x85f715);
  iVar2._M_len = (size_type)in_stack_ffffffffffffebe0;
  iVar2._M_array = (iterator)in_stack_ffffffffffffebd8;
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffebd0,iVar2,(allocator_type *)in_stack_ffffffffffffebc8);
  amrex::MLMG::getFluxes
            (in_stack_ffffffffffffebe8,
             (Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
              *)in_stack_ffffffffffffebe0,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffebd8,(Location)((ulong)in_stack_ffffffffffffebd0 >> 0x20));
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x85f76d);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x85f77a);
  amrex::
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>::
  ~Vector((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
           *)0x85f787);
  std::allocator<std::array<amrex::MultiFab_*,_3UL>_>::~allocator
            ((allocator<std::array<amrex::MultiFab_*,_3UL>_> *)0x85f794);
  pFVar6 = amrex::FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x85f7a1);
  local_ce8._24_8_ =
       __dynamic_cast(pFVar6,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                      &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (local_ce8._24_8_ != 0) {
    amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffebd0);
    local_ce8._16_8_ = auStack_cf8._8_8_;
    local_ce8._0_8_ = local_d14._20_8_;
    local_ce8._8_8_ = auStack_cf8._0_8_;
    this_01 = (MFIter *)local_d14;
    amrex::MFItInfo::MFItInfo(in_stack_ffffffffffffebe0);
    this = amrex::MFItInfo::EnableTiling
                     ((MFItInfo *)this_01,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size);
    amrex::MFItInfo::SetDynamic(this,true);
    amrex::MFIter::MFIter
              (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    while( true ) {
      iVar9 = (int)((ulong)in_stack_ffffffffffffec38 >> 0x20);
      bVar4 = amrex::MFIter::isValid(&local_d78);
      if (!bVar4) break;
      plVar8 = local_dc0;
      this_00 = &local_d78;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffebd8,(MFIter *)in_stack_ffffffffffffebd0);
      local_d80 = plVar8;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffebd8,(MFIter *)in_stack_ffffffffffffebd0);
      local_dc8 = local_e08;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffebd8,(MFIter *)in_stack_ffffffffffffebd0);
      local_e10 = local_e50;
      amrex::MFIter::nodaltilebox(this_01,iVar9);
      amrex::MFIter::nodaltilebox(this_01,iVar9);
      amrex::MFIter::nodaltilebox(this_01,iVar9);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffebd8,(MFIter *)in_stack_ffffffffffffebd0);
      local_eb0 = local_ef0;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffebd8,(MFIter *)in_stack_ffffffffffffebd0);
      local_ef8 = local_f38;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffebd8,(MFIter *)in_stack_ffffffffffffebd0);
      local_f40 = local_f80;
      amrex::MFIter::tilebox(this_00);
      local_fa8 = (EBFArrayBox *)
                  amrex::FabArray<amrex::FArrayBox>::operator[]
                            ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffebd0,
                             in_stack_ffffffffffffebc8);
      in_stack_ffffffffffffec38 = amrex::EBFArrayBox::getEBCellFlagFab(local_fa8);
      local_758 = local_f9c;
      local_75c = 0;
      local_fb0 = in_stack_ffffffffffffec38;
      amrex::Box::grow(&local_fcc,0);
      FVar5 = amrex::EBCellFlagFab::getType
                        ((EBCellFlagFab *)
                         CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),
                         in_stack_ffffffffffffecf0);
      if (FVar5 == covered) {
        local_4c0 = &local_e6c;
        local_48c = 0;
        local_49c = 1;
        local_4ac = 2;
        local_1b8 = &iStack_e60;
        local_1bc = 0;
        local_1c8 = &iStack_e60;
        local_1cc = 1;
        local_1d8 = &iStack_e60;
        local_1dc = 2;
        for (local_100c = 0; iVar9 = iStack_e64, local_100c < local_790; local_100c = local_100c + 1
            ) {
          while (local_1010 = iVar9, iVar9 = local_e68, local_1010 <= iStack_e58) {
            while (local_1014 = iVar9, iVar9 = local_e6c, local_1014 <= local_e5c) {
              while (local_1018 = iVar9, local_1018 <= iStack_e60) {
                local_e0 = local_d80;
                local_e4 = local_1018;
                local_e8 = local_1014;
                local_ec = local_1010;
                local_f0 = local_100c;
                *(undefined8 *)
                 (*local_d80 +
                 ((long)(local_1018 - (int)local_d80[4]) +
                  (long)(local_1014 - *(int *)((long)local_d80 + 0x24)) * local_d80[1] +
                  (long)(local_1010 - (int)local_d80[5]) * local_d80[2] +
                 (long)local_100c * local_d80[3]) * 8) = 0x483d6329f1c35ca5;
                iVar9 = local_1018 + 1;
              }
              iVar9 = local_1014 + 1;
            }
            iVar9 = local_1010 + 1;
          }
        }
        local_510 = &local_e88;
        local_4dc = 0;
        local_4ec = 1;
        local_4fc = 2;
        local_208 = &iStack_e7c;
        local_20c = 0;
        local_218 = &iStack_e7c;
        local_21c = 1;
        local_228 = &iStack_e7c;
        local_22c = 2;
        for (local_105c = 0; iVar9 = iStack_e80, local_105c < local_790; local_105c = local_105c + 1
            ) {
          while (local_1060 = iVar9, iVar9 = local_e84, local_1060 <= iStack_e74) {
            while (local_1064 = iVar9, iVar9 = local_e88, local_1064 <= local_e78) {
              while (local_1068 = iVar9, local_1068 <= iStack_e7c) {
                local_f8 = local_dc8;
                local_fc = local_1068;
                local_100 = local_1064;
                local_104 = local_1060;
                local_108 = local_105c;
                *(undefined8 *)
                 (*local_dc8 +
                 ((long)(local_1068 - (int)local_dc8[4]) +
                  (long)(local_1064 - *(int *)((long)local_dc8 + 0x24)) * local_dc8[1] +
                  (long)(local_1060 - (int)local_dc8[5]) * local_dc8[2] +
                 (long)local_105c * local_dc8[3]) * 8) = 0x483d6329f1c35ca5;
                iVar9 = local_1068 + 1;
              }
              iVar9 = local_1064 + 1;
            }
            iVar9 = local_1060 + 1;
          }
        }
        local_560 = &local_ea4;
        local_52c = 0;
        local_53c = 1;
        local_54c = 2;
        local_258 = &iStack_e98;
        local_25c = 0;
        local_268 = &iStack_e98;
        local_26c = 1;
        local_278 = &iStack_e98;
        local_27c = 2;
        for (local_10ac = 0; iVar9 = iStack_e9c, local_548 = local_560, local_538 = local_560,
            local_528 = local_560, local_4f8 = local_510, local_4e8 = local_510,
            local_4d8 = local_510, local_4a8 = local_4c0, local_498 = local_4c0,
            local_488 = local_4c0, local_290 = local_560, local_240 = local_510,
            local_1f0 = local_4c0, local_10ac < local_790; local_10ac = local_10ac + 1) {
          while (local_10b0 = iVar9, iVar9 = local_ea0, local_10b0 <= iStack_e90) {
            while (local_10b4 = iVar9, uVar3 = local_ea4, local_10b4 <= local_e94) {
              while (local_10b8 = uVar3, (int)local_10b8 <= iStack_e98) {
                local_110 = local_e10;
                local_114 = local_10b8;
                local_118 = local_10b4;
                local_11c = local_10b0;
                local_120 = local_10ac;
                *(undefined8 *)
                 (*local_e10 +
                 ((long)(int)(local_10b8 - (int)local_e10[4]) +
                  (long)(local_10b4 - *(int *)((long)local_e10 + 0x24)) * local_e10[1] +
                  (long)(local_10b0 - (int)local_e10[5]) * local_e10[2] +
                 (long)local_10ac * local_e10[3]) * 8) = 0x483d6329f1c35ca5;
                uVar3 = local_10b8 + 1;
              }
              iVar9 = local_10b4 + 1;
            }
            iVar9 = local_10b0 + 1;
          }
        }
      }
      else {
        local_768 = local_f9c;
        local_76c = 0;
        amrex::Box::grow(&local_10d4,0);
        FVar5 = amrex::EBCellFlagFab::getType
                          ((EBCellFlagFab *)
                           CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),
                           in_stack_ffffffffffffecf0);
        if (FVar5 == regular) {
          local_6a0 = &local_e6c;
          local_66c = 0;
          local_67c = 1;
          local_68c = 2;
          local_398 = &iStack_e60;
          local_39c = 0;
          local_3a8 = &iStack_e60;
          local_3ac = 1;
          local_3b8 = &iStack_e60;
          local_3bc = 2;
          for (local_12e4 = 0; local_12e8 = iStack_e64, local_12e4 < local_790;
              local_12e4 = local_12e4 + 1) {
            for (; local_12ec = local_e68, local_12e8 <= iStack_e58; local_12e8 = local_12e8 + 1) {
              for (; local_12f0 = local_e6c, local_12ec <= local_e5c; local_12ec = local_12ec + 1) {
                for (; local_12f0 <= iStack_e60; local_12f0 = local_12f0 + 1) {
                  local_98 = local_eb0;
                  local_9c = local_12f0;
                  local_a0 = local_12ec;
                  local_a4 = local_12e8;
                  local_170 = local_d80;
                  local_174 = local_12f0;
                  local_178 = local_12ec;
                  local_17c = local_12e8;
                  local_180 = local_12e4;
                  lVar7 = (long)(local_12f0 - (int)local_d80[4]) +
                          (long)(local_12ec - *(int *)((long)local_d80 + 0x24)) * local_d80[1] +
                          (long)(local_12e8 - (int)local_d80[5]) * local_d80[2] +
                          (long)local_12e4 * local_d80[3];
                  *(double *)(*local_d80 + lVar7 * 8) =
                       local_7a0 *
                       *(double *)
                        (*local_eb0 +
                        ((long)(local_12f0 - (int)local_eb0[4]) +
                         (long)(local_12ec - *(int *)((long)local_eb0 + 0x24)) * local_eb0[1] +
                        (long)(local_12e8 - (int)local_eb0[5]) * local_eb0[2]) * 8) *
                       *(double *)(*local_d80 + lVar7 * 8);
                }
              }
            }
          }
          local_6f0 = &local_e88;
          local_6bc = 0;
          local_6cc = 1;
          in_stack_ffffffffffffecf0 = (Box *)CONCAT44(local_e84,local_e88);
          local_6dc = 2;
          local_3e8 = &iStack_e7c;
          local_3ec = 0;
          local_3f8 = &iStack_e7c;
          local_3fc = 1;
          local_408 = &iStack_e7c;
          local_40c = 2;
          for (local_1334 = 0; local_1338 = iStack_e80, local_1334 < local_790;
              local_1334 = local_1334 + 1) {
            for (; local_133c = local_e84, local_1338 <= iStack_e74; local_1338 = local_1338 + 1) {
              for (; local_1340 = local_e88, local_133c <= local_e78; local_133c = local_133c + 1) {
                for (; local_1340 <= iStack_e7c; local_1340 = local_1340 + 1) {
                  local_b0 = local_ef8;
                  local_b4 = local_1340;
                  local_b8 = local_133c;
                  local_bc = local_1338;
                  local_188 = local_dc8;
                  local_18c = local_1340;
                  local_190 = local_133c;
                  local_194 = local_1338;
                  local_198 = local_1334;
                  lVar7 = (long)(local_1340 - (int)local_dc8[4]) +
                          (long)(local_133c - *(int *)((long)local_dc8 + 0x24)) * local_dc8[1] +
                          (long)(local_1338 - (int)local_dc8[5]) * local_dc8[2] +
                          (long)local_1334 * local_dc8[3];
                  *(double *)(*local_dc8 + lVar7 * 8) =
                       local_7a0 *
                       *(double *)
                        (*local_ef8 +
                        ((long)(local_1340 - (int)local_ef8[4]) +
                         (long)(local_133c - *(int *)((long)local_ef8 + 0x24)) * local_ef8[1] +
                        (long)(local_1338 - (int)local_ef8[5]) * local_ef8[2]) * 8) *
                       *(double *)(*local_dc8 + lVar7 * 8);
                }
              }
            }
          }
          local_740 = &local_ea4;
          local_70c = 0;
          local_71c = 1;
          local_72c = 2;
          local_438 = &iStack_e98;
          local_43c = 0;
          local_448 = &iStack_e98;
          local_44c = 1;
          local_458 = &iStack_e98;
          local_45c = 2;
          for (local_1384 = 0; local_1388 = iStack_e9c, in_stack_ffffffffffffecf8 = iStack_e80,
              local_728 = local_740, local_718 = local_740, local_708 = local_740,
              local_6d8 = local_6f0, local_6c8 = local_6f0, local_6b8 = local_6f0,
              local_688 = local_6a0, local_678 = local_6a0, local_668 = local_6a0,
              local_470 = local_740, local_420 = local_6f0, local_3d0 = local_6a0,
              local_1384 < local_790; local_1384 = local_1384 + 1) {
            for (; local_138c = local_ea0, local_1388 <= iStack_e90; local_1388 = local_1388 + 1) {
              for (; local_1390 = local_ea4, local_138c <= local_e94; local_138c = local_138c + 1) {
                for (; (int)local_1390 <= iStack_e98; local_1390 = local_1390 + 1) {
                  local_c8 = local_f40;
                  local_cc = local_1390;
                  local_d0 = local_138c;
                  local_d4 = local_1388;
                  local_1a0 = local_e10;
                  local_1a4 = local_1390;
                  local_1a8 = local_138c;
                  local_1ac = local_1388;
                  local_1b0 = local_1384;
                  lVar7 = (long)(int)(local_1390 - (int)local_e10[4]) +
                          (long)(local_138c - *(int *)((long)local_e10 + 0x24)) * local_e10[1] +
                          (long)(local_1388 - (int)local_e10[5]) * local_e10[2] +
                          (long)local_1384 * local_e10[3];
                  *(double *)(*local_e10 + lVar7 * 8) =
                       local_7a0 *
                       *(double *)
                        (*local_f40 +
                        ((long)(int)(local_1390 - (int)local_f40[4]) +
                         (long)(local_138c - *(int *)((long)local_f40 + 0x24)) * local_f40[1] +
                        (long)(local_1388 - (int)local_f40[5]) * local_f40[2]) * 8) *
                       *(double *)(*local_e10 + lVar7 * 8);
                }
              }
            }
          }
        }
        else {
          in_stack_ffffffffffffebd8 = (FabArray<amrex::FArrayBox> *)local_ce8;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffebd0,
                     (size_type)in_stack_ffffffffffffebc8);
          in_stack_ffffffffffffebc8 = (MFIter *)(local_1168 + 0x48);
          amrex::MultiCutFab::array(in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
          local_10e0 = in_stack_ffffffffffffebc8;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffebd0,
                     (size_type)in_stack_ffffffffffffebc8);
          in_stack_ffffffffffffebd0 = (MultiCutFab *)local_1168;
          amrex::MultiCutFab::array(in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
          local_1168._64_8_ = in_stack_ffffffffffffebd0;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffebd0,
                     (size_type)in_stack_ffffffffffffebc8);
          plVar8 = local_11b0;
          amrex::MultiCutFab::array(in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
          local_5b0 = &local_e6c;
          local_57c = 0;
          local_58c = 1;
          local_59c = 2;
          local_2a8 = &iStack_e60;
          local_2ac = 0;
          local_2b8 = &iStack_e60;
          local_2bc = 1;
          local_2c8 = &iStack_e60;
          local_2cc = 2;
          for (local_11f4 = 0; local_11f8 = iStack_e64, local_11f4 < local_790;
              local_11f4 = local_11f4 + 1) {
            for (; local_11fc = local_e68, local_11f8 <= iStack_e58; local_11f8 = local_11f8 + 1) {
              for (; local_1200 = local_e6c, local_11fc <= local_e5c; local_11fc = local_11fc + 1) {
                for (; local_1200 <= iStack_e60; local_1200 = local_1200 + 1) {
                  local_50 = local_eb0;
                  local_54 = local_1200;
                  local_58 = local_11fc;
                  local_5c = local_11f8;
                  local_8 = local_10e0;
                  local_c = local_1200;
                  local_10 = local_11fc;
                  local_14 = local_11f8;
                  local_128 = local_d80;
                  local_12c = local_1200;
                  local_130 = local_11fc;
                  local_134 = local_11f8;
                  local_138 = local_11f4;
                  lVar7 = (long)(local_1200 - (int)local_d80[4]) +
                          (long)(local_11fc - *(int *)((long)local_d80 + 0x24)) * local_d80[1] +
                          (long)(local_11f8 - (int)local_d80[5]) * local_d80[2] +
                          (long)local_11f4 * local_d80[3];
                  *(double *)(*local_d80 + lVar7 * 8) =
                       local_7a0 *
                       *(double *)
                        (*local_eb0 +
                        ((long)(local_1200 - (int)local_eb0[4]) +
                         (long)(local_11fc - *(int *)((long)local_eb0 + 0x24)) * local_eb0[1] +
                        (long)(local_11f8 - (int)local_eb0[5]) * local_eb0[2]) * 8) *
                       *(double *)
                        ((long)&((local_10e0->m_fa)._M_t.
                                 super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)
                                ->_vptr_FabArrayBase +
                        ((long)(local_1200 - local_10e0->currentIndex) +
                         (long)(local_11fc - local_10e0->beginIndex) * (long)local_10e0->fabArray +
                        (long)(local_11f8 - local_10e0->endIndex) *
                        *(long *)(local_10e0->tile_size).vect) * 8) *
                       *(double *)(*local_d80 + lVar7 * 8);
                }
              }
            }
          }
          local_600 = &local_e88;
          local_5cc = 0;
          local_5dc = 1;
          local_5ec = 2;
          local_2f8 = &iStack_e7c;
          local_2fc = 0;
          local_308 = &iStack_e7c;
          local_30c = 1;
          local_318 = &iStack_e7c;
          local_31c = 2;
          for (local_1244 = 0; local_1248 = iStack_e80, local_1244 < local_790;
              local_1244 = local_1244 + 1) {
            for (; local_124c = local_e84, local_1248 <= iStack_e74; local_1248 = local_1248 + 1) {
              for (; local_1250 = local_e88, local_124c <= local_e78; local_124c = local_124c + 1) {
                for (; local_1250 <= iStack_e7c; local_1250 = local_1250 + 1) {
                  local_68 = local_ef8;
                  local_6c = local_1250;
                  local_70 = local_124c;
                  local_74 = local_1248;
                  local_20 = (MultiCutFab *)local_1168._64_8_;
                  local_24 = local_1250;
                  local_28 = local_124c;
                  local_2c = local_1248;
                  local_140 = local_dc8;
                  local_144 = local_1250;
                  local_148 = local_124c;
                  local_14c = local_1248;
                  local_150 = local_1244;
                  lVar7 = (long)(local_1250 - (int)local_dc8[4]) +
                          (long)(local_124c - *(int *)((long)local_dc8 + 0x24)) * local_dc8[1] +
                          (long)(local_1248 - (int)local_dc8[5]) * local_dc8[2] +
                          (long)local_1244 * local_dc8[3];
                  *(double *)(*local_dc8 + lVar7 * 8) =
                       local_7a0 *
                       *(double *)
                        (*local_ef8 +
                        ((long)(local_1250 - (int)local_ef8[4]) +
                         (long)(local_124c - *(int *)((long)local_ef8 + 0x24)) * local_ef8[1] +
                        (long)(local_1248 - (int)local_ef8[5]) * local_ef8[2]) * 8) *
                       *(double *)
                        (*(long *)local_1168._64_8_ +
                        ((long)(local_1250 - *(int *)(local_1168._64_8_ + 0x20)) +
                         (long)(local_124c - *(int *)(local_1168._64_8_ + 0x24)) *
                         *(long *)&((BoxArray *)(local_1168._64_8_ + 8))->m_bat +
                        (long)(local_1248 - *(int *)(local_1168._64_8_ + 0x28)) *
                        *(long *)(local_1168._64_8_ + 0x10)) * 8) *
                       *(double *)(*local_dc8 + lVar7 * 8);
                }
              }
            }
          }
          local_650 = &local_ea4;
          local_61c = 0;
          local_62c = 1;
          local_63c = 2;
          local_348 = &iStack_e98;
          local_34c = 0;
          local_358 = &iStack_e98;
          local_35c = 1;
          local_368 = &iStack_e98;
          local_36c = 2;
          for (local_1294 = 0; local_1298 = iStack_e9c, local_1170 = plVar8, local_638 = local_650,
              local_628 = local_650, local_618 = local_650, local_5e8 = local_600,
              local_5d8 = local_600, local_5c8 = local_600, local_598 = local_5b0,
              local_588 = local_5b0, local_578 = local_5b0, local_380 = local_650,
              local_330 = local_600, local_2e0 = local_5b0, local_1294 < local_790;
              local_1294 = local_1294 + 1) {
            for (; local_129c = local_ea0, local_1298 <= iStack_e90; local_1298 = local_1298 + 1) {
              for (; local_12a0 = local_ea4, local_129c <= local_e94; local_129c = local_129c + 1) {
                for (; (int)local_12a0 <= iStack_e98; local_12a0 = local_12a0 + 1) {
                  local_80 = local_f40;
                  local_84 = local_12a0;
                  local_88 = local_129c;
                  local_8c = local_1298;
                  local_3c = local_12a0;
                  local_40 = local_129c;
                  local_44 = local_1298;
                  local_158 = local_e10;
                  local_15c = local_12a0;
                  local_160 = local_129c;
                  local_164 = local_1298;
                  local_168 = local_1294;
                  lVar7 = (long)(int)(local_12a0 - (int)local_e10[4]) +
                          (long)(local_129c - *(int *)((long)local_e10 + 0x24)) * local_e10[1] +
                          (long)(local_1298 - (int)local_e10[5]) * local_e10[2] +
                          (long)local_1294 * local_e10[3];
                  *(double *)(*local_e10 + lVar7 * 8) =
                       local_7a0 *
                       *(double *)
                        (*local_f40 +
                        ((long)(int)(local_12a0 - (int)local_f40[4]) +
                         (long)(local_129c - *(int *)((long)local_f40 + 0x24)) * local_f40[1] +
                        (long)(local_1298 - (int)local_f40[5]) * local_f40[2]) * 8) *
                       *(double *)
                        (*plVar8 +
                        ((long)(int)(local_12a0 - (int)plVar8[4]) +
                         (long)(local_129c - *(int *)((long)plVar8 + 0x24)) * plVar8[1] +
                        (long)(local_1298 - (int)plVar8[5]) * plVar8[2]) * 8) *
                       *(double *)(*local_e10 + lVar7 * 8);
                  local_38 = plVar8;
                }
              }
            }
          }
        }
      }
      amrex::MFIter::operator++(&local_d78);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffebd0);
    amrex::MultiFab::~MultiFab((MultiFab *)0x862264);
    amrex::MultiFab::~MultiFab((MultiFab *)0x862271);
    amrex::MultiFab::~MultiFab((MultiFab *)0x86227e);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
Diffusion::computeExtensiveFluxes(MLMG& a_mg, MultiFab& Soln,
                                  MultiFab* const* flux, const int fluxComp,
                                  const int ncomp, MultiFab* area,
                                  const Real fac )
{
   BL_ASSERT(flux[0]->nGrow()==0);

   AMREX_D_TERM(MultiFab flxx(*flux[0], amrex::make_alias, fluxComp, ncomp);,
                MultiFab flxy(*flux[1], amrex::make_alias, fluxComp, ncomp);,
                MultiFab flxz(*flux[2], amrex::make_alias, fluxComp, ncomp););
   std::array<MultiFab*,AMREX_SPACEDIM> fp{AMREX_D_DECL(&flxx,&flxy,&flxz)};

   a_mg.getFluxes({fp},{&Soln},MLLinOp::Location::FaceCentroid);

#ifdef AMREX_USE_EB
   auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Soln.Factory());
   Array< const MultiCutFab*,AMREX_SPACEDIM> areafrac;
   areafrac  = ebfactory.getAreaFrac();
#endif

   MFItInfo mfi_info;
   if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(Soln, mfi_info); mfi.isValid(); ++mfi)
   {
      D_TERM( const auto& fx = flxx.array(mfi);,
              const auto& fy = flxy.array(mfi);,
              const auto& fz = flxz.array(mfi););

      D_TERM( const Box ubx = mfi.nodaltilebox(0);,
              const Box vbx = mfi.nodaltilebox(1);,
              const Box wbx = mfi.nodaltilebox(2););

      D_TERM( const auto& areax = area[0].array(mfi);,
              const auto& areay = area[1].array(mfi);,
              const auto& areaz = area[2].array(mfi););

#ifdef AMREX_USE_EB
      Box bx = mfi.tilebox();

      const EBFArrayBox&     cc_fab = static_cast<EBFArrayBox const&>(Soln[mfi]);
      const EBCellFlagFab&    flags = cc_fab.getEBCellFlagFab();

      if ( flags.getType(amrex::grow(bx,0)) == FabType::covered )
      {
         //
         // For now, set to very large num so we know if you accidentally use it
         // MLMG will set covered fluxes to zero
         //
         D_TERM(AMREX_PARALLEL_FOR_4D(ubx, ncomp, i, j, k, n, {fx(i,j,k,n) = COVERED_VAL;});,
                AMREX_PARALLEL_FOR_4D(vbx, ncomp, i, j, k, n, {fy(i,j,k,n) = COVERED_VAL;});,
                AMREX_PARALLEL_FOR_4D(wbx, ncomp, i, j, k, n, {fz(i,j,k,n) = COVERED_VAL;}););
      }
      else if ( flags.getType(amrex::grow(bx,0)) != FabType::regular )
      {
	 D_TERM( const auto& afrac_x = areafrac[0]->array(mfi);,
		 const auto& afrac_y = areafrac[1]->array(mfi);,
		 const auto& afrac_z = areafrac[2]->array(mfi););

	 D_TERM(AMREX_PARALLEL_FOR_4D(ubx, ncomp, i, j, k, n, {fx(i,j,k,n) *= fac*areax(i,j,k)*afrac_x(i,j,k);});,
		AMREX_PARALLEL_FOR_4D(vbx, ncomp, i, j, k, n, {fy(i,j,k,n) *= fac*areay(i,j,k)*afrac_y(i,j,k);});,
                AMREX_PARALLEL_FOR_4D(wbx, ncomp, i, j, k, n, {fz(i,j,k,n) *= fac*areaz(i,j,k)*afrac_z(i,j,k);}););
      }
      else
#endif
      {
	D_TERM(AMREX_PARALLEL_FOR_4D(ubx, ncomp, i, j, k, n, {fx(i,j,k,n) *= fac*areax(i,j,k);});,
	       AMREX_PARALLEL_FOR_4D(vbx, ncomp, i, j, k, n, {fy(i,j,k,n) *= fac*areay(i,j,k);});,
	       AMREX_PARALLEL_FOR_4D(wbx, ncomp, i, j, k, n, {fz(i,j,k,n) *= fac*areaz(i,j,k);}););
      }
   }
}